

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O1

TimestepInfo * __thiscall
adios2::format::BP5Serializer::CloseTimestep
          (TimestepInfo *__return_storage_ptr__,BP5Serializer *this,int timestep,
          bool forceCopyDeferred)

{
  _func_int **pp_Var1;
  FMFieldList p_Var2;
  pointer pp_Var3;
  _FMFormatBody *p_Var4;
  pointer pcVar5;
  TimestepInfo *pTVar6;
  undefined4 uVar7;
  int iVar8;
  FMFormat p_Var9;
  FFSBuffer p_Var10;
  undefined4 extraout_var;
  void *pvVar11;
  BufferFFS *this_00;
  BufferFFS *this_01;
  undefined7 in_register_00000009;
  long lVar12;
  pointer pp_Var13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  byte bVar16;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  Formats;
  MetaMetaInfoBlock Block;
  size_t AttributeSize;
  size_t MetaDataSize;
  int size;
  FMStructDescRec struct_list [4];
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  local_358;
  undefined1 local_338 [32];
  size_t local_318;
  undefined4 local_30c;
  size_t local_308;
  string local_300;
  TimestepInfo *local_2e0;
  string local_2d8;
  undefined1 local_2b8 [32];
  char *local_298;
  undefined1 *local_290;
  undefined4 local_288;
  undefined8 local_280;
  char *local_278;
  undefined1 *local_270;
  undefined4 local_268;
  undefined8 local_260;
  char *local_258;
  undefined8 local_250;
  undefined4 local_248;
  undefined8 local_240;
  char *local_238;
  undefined8 local_230;
  undefined4 local_228;
  undefined8 local_220;
  char *local_218;
  undefined8 local_210;
  undefined4 local_208;
  undefined8 local_200;
  char *local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined8 local_1b0;
  undefined4 local_1a8;
  undefined8 local_1a0;
  char *local_198;
  undefined8 local_190;
  undefined4 local_188;
  undefined8 local_180;
  char *local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined8 local_160;
  char *local_158;
  undefined8 local_150;
  undefined4 local_148;
  undefined8 local_140;
  char *local_138;
  undefined8 local_130;
  undefined4 local_128;
  undefined8 local_120;
  char *local_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined8 local_100;
  char *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined8 uStack_cc;
  undefined1 local_c0 [144];
  
  bVar16 = 0;
  local_358.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (MetaMetaInfoBlock *)0x0;
  local_358.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (MetaMetaInfoBlock *)0x0;
  if (((this->Info).MetaFormat == (FMFormat)0x0) && ((this->Info).MetaFieldCount != 0)) {
    local_2b8._24_8_ = 0;
    local_2b8._0_8_ = (char *)0x0;
    local_2b8._8_8_ = 0;
    local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffff00000000;
    local_298 = "complex4";
    local_290 = fcomplex_field_list;
    local_288 = 8;
    local_280 = 0;
    local_278 = "complex8";
    local_270 = dcomplex_field_list;
    local_268 = 0x10;
    local_260 = 0;
    local_258 = "MetaArray";
    pp_Var1 = this->_vptr_BP5Serializer;
    local_250 = *(undefined8 *)(&this->field_0x240 + (long)pp_Var1[-3]);
    local_248 = 0x38;
    local_240 = 0;
    local_238 = "MetaArrayOp";
    local_230 = *(undefined8 *)(&this->field_0x248 + (long)pp_Var1[-3]);
    local_228 = 0x40;
    local_220 = 0;
    local_218 = "MetaArrayMM1";
    local_210 = *(undefined8 *)(&this->field_0x250 + (long)pp_Var1[-3]);
    local_208 = 0x40;
    local_200 = 0;
    local_1f8 = "MetaArrayOpMM1";
    local_1f0 = *(undefined8 *)(&this->field_0x258 + (long)pp_Var1[-3]);
    local_1e8 = 0x48;
    local_1e0 = 0;
    local_1d8 = "MetaArrayMM2";
    local_1d0 = *(undefined8 *)(&this->field_0x260 + (long)pp_Var1[-3]);
    local_1c8 = 0x40;
    local_1c0 = 0;
    local_1b8 = "MetaArrayOpMM2";
    local_1b0 = *(undefined8 *)(&this->field_0x268 + (long)pp_Var1[-3]);
    local_1a8 = 0x48;
    local_1a0 = 0;
    local_198 = "MetaArrayMM4";
    local_190 = *(undefined8 *)(&this->field_0x270 + (long)pp_Var1[-3]);
    local_188 = 0x40;
    local_180 = 0;
    local_178 = "MetaArrayOpMM4";
    local_170 = *(undefined8 *)(&this->field_0x278 + (long)pp_Var1[-3]);
    local_168 = 0x48;
    local_160 = 0;
    local_158 = "MetaArrayMM8";
    local_150 = *(undefined8 *)(&this->field_0x280 + (long)pp_Var1[-3]);
    local_148 = 0x40;
    local_140 = 0;
    local_138 = "MetaArrayOpMM8";
    local_130 = *(undefined8 *)(&this->field_0x288 + (long)pp_Var1[-3]);
    local_128 = 0x48;
    local_120 = 0;
    local_118 = "MetaArrayMM16";
    local_110 = *(undefined8 *)(&this->field_0x290 + (long)pp_Var1[-3]);
    local_108 = 0x40;
    local_100 = 0;
    local_f8 = "MetaArrayOpMM16";
    local_f0 = *(undefined8 *)(&this->field_0x298 + (long)pp_Var1[-3]);
    local_e8 = 0x48;
    local_e0 = 0;
    uStack_d8 = 0;
    uStack_d4 = 0;
    uStack_d0 = 0;
    uStack_cc = 0;
    memset(local_c0,0,0x88);
    local_2b8._0_8_ = "MetaData";
    local_2b8._8_8_ = (this->Info).MetaFields;
    uVar7 = FMstruct_size_field_list(local_2b8._8_8_,8);
    local_2b8._16_4_ = uVar7;
    p_Var9 = (FMFormat)register_data_format((this->Info).LocalFMContext);
    (this->Info).MetaFormat = p_Var9;
    local_338._0_8_ = get_server_rep_FMformat(p_Var9,&local_300);
    local_338._8_8_ = SEXT48((int)local_300._M_dataplus._M_p);
    local_338._16_8_ = get_server_ID_FMformat(p_Var9);
    local_338._24_8_ = SEXT48((int)local_300._M_dataplus._M_p);
    if (local_358.
        super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_358.
        super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
      ::_M_realloc_insert<adios2::format::BP5Base::MetaMetaInfoBlock_const&>
                ((vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
                  *)&local_358,
                 (iterator)
                 local_358.
                 super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(MetaMetaInfoBlock *)local_338);
    }
    else {
      (local_358.
       super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaID = (char *)local_338._16_8_;
      (local_358.
       super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaIDLen = local_338._24_8_;
      (local_358.
       super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaInfo = (char *)local_338._0_8_;
      (local_358.
       super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaInfoLen = local_338._8_8_;
      local_358.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_358.
           super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if ((this->NewAttribute == true) &&
     (p_Var2 = (this->Info).AttributeFields, p_Var2 != (FMFieldList)0x0)) {
    puVar14 = &DAT_00884e20;
    puVar15 = (undefined8 *)local_2b8;
    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar15 = *puVar14;
      puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar16 * -2 + 1;
    }
    local_2b8._0_8_ = "Attributes";
    local_2b8._8_8_ = p_Var2;
    uVar7 = FMstruct_size_field_list(p_Var2,8);
    local_2b8._16_4_ = uVar7;
    p_Var9 = (FMFormat)register_data_format((this->Info).LocalFMContext);
    (this->Info).AttributeFormat = p_Var9;
    local_338._0_8_ = get_server_rep_FMformat(p_Var9,&local_300);
    local_338._8_8_ = SEXT48((int)local_300._M_dataplus._M_p);
    local_338._16_8_ = get_server_ID_FMformat(p_Var9);
    local_338._24_8_ = SEXT48((int)local_300._M_dataplus._M_p);
    if (local_358.
        super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_358.
        super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
      ::_M_realloc_insert<adios2::format::BP5Base::MetaMetaInfoBlock_const&>
                ((vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
                  *)&local_358,
                 (iterator)
                 local_358.
                 super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(MetaMetaInfoBlock *)local_338);
    }
    else {
      (local_358.
       super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaID = (char *)local_338._16_8_;
      (local_358.
       super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaIDLen = local_338._24_8_;
      (local_358.
       super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaInfo = (char *)local_338._0_8_;
      (local_358.
       super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaInfoLen = local_338._8_8_;
      local_358.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_358.
           super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  local_30c = (undefined4)CONCAT71(in_register_00000009,forceCopyDeferred);
  pp_Var13 = (this->NewStructFormats).
             super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  pp_Var3 = (this->NewStructFormats).
            super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_2e0 = __return_storage_ptr__;
  if (pp_Var13 != pp_Var3) {
    do {
      p_Var4 = *pp_Var13;
      local_2b8._0_8_ = get_server_rep_FMformat(p_Var4,local_338);
      local_2b8._8_8_ = SEXT48((int)local_338._0_4_);
      local_2b8._16_8_ = get_server_ID_FMformat(p_Var4,local_338);
      local_2b8._24_8_ = SEXT48((int)local_338._0_4_);
      if (local_358.
          super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_358.
          super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
        ::_M_realloc_insert<adios2::format::BP5Base::MetaMetaInfoBlock_const&>
                  ((vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
                    *)&local_358,
                   (iterator)
                   local_358.
                   super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(MetaMetaInfoBlock *)local_2b8);
      }
      else {
        (local_358.
         super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaID = (char *)local_2b8._16_8_;
        (local_358.
         super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaIDLen = local_2b8._24_8_;
        (local_358.
         super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaInfo = (char *)local_2b8._0_8_;
        (local_358.
         super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaInfoLen = local_2b8._8_8_;
        local_358.
        super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_358.
             super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pp_Var13 = pp_Var13 + 1;
    } while (pp_Var13 != pp_Var3);
  }
  pp_Var13 = (this->NewStructFormats).
             super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->NewStructFormats).super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != pp_Var13) {
    (this->NewStructFormats).super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = pp_Var13;
  }
  p_Var10 = (FFSBuffer)create_FFSBuffer();
  local_308 = 0;
  local_318 = 0;
  pvVar11 = this->MetadataBuf;
  if (this->CurDataBuffer == (BufferV *)0x0) {
    local_2b8._0_8_ = local_2b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Toolkit","");
    local_338._0_8_ = local_338 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"format::BP5Serializer","");
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"CloseTimestep","");
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"without prior Init","");
    helper::Throw<std::logic_error>
              ((string *)local_2b8,(string *)local_338,&local_300,&local_2d8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_);
    }
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_);
    }
  }
  DumpDeferredBlocks(this,local_30c._0_1_);
  iVar8 = (*this->CurDataBuffer->_vptr_BufferV[4])
                    (this->CurDataBuffer,0,0,this->m_BufferBlockSize,1,1);
  *(long *)((long)pvVar11 + 0x10) = CONCAT44(extraout_var,iVar8);
  *(size_t *)((long)pvVar11 + 0x10) =
       CONCAT44(extraout_var,iVar8) + this->m_PriorDataBufferSizeTotal;
  ProcessDeferredMinMax(this);
  CollectFinalShapeValues(this);
  pvVar11 = (void *)FFSencode(p_Var10,(this->Info).MetaFormat,this->MetadataBuf,&local_308);
  this_00 = (BufferFFS *)operator_new(0x50);
  BufferFFS::BufferFFS(this_00,p_Var10,pvVar11,local_308);
  if (this->PendingAttrs == (BP5AttrStruct *)0x0) {
    this_01 = (BufferFFS *)0x0;
    if ((this->NewAttribute == true) && ((this->Info).AttributeFields != (FMFieldList)0x0)) {
      p_Var10 = (FFSBuffer)create_FFSBuffer();
      pvVar11 = (void *)FFSencode(p_Var10,(this->Info).AttributeFormat,(this->Info).AttributeData,
                                  &local_318);
      this_01 = (BufferFFS *)operator_new(0x50);
      BufferFFS::BufferFFS(this_01,p_Var10,pvVar11,local_318);
    }
  }
  else {
    if (this->GenericAttributeFormat == (FMFormat)0x0) {
      p_Var9 = (FMFormat)
               register_data_format
                         ((this->Info).LocalFMContext,
                          &this->field_0x1c0 + (long)this->_vptr_BP5Serializer[-3]);
      this->GenericAttributeFormat = p_Var9;
      (this->Info).AttributeFormat = p_Var9;
      local_2b8._0_8_ = get_server_rep_FMformat(p_Var9,local_338);
      local_2b8._8_8_ = SEXT48((int)local_338._0_4_);
      local_2b8._16_8_ = get_server_ID_FMformat(this->GenericAttributeFormat);
      local_2b8._24_8_ = SEXT48((int)local_338._0_4_);
      if (local_358.
          super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_358.
          super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
        ::_M_realloc_insert<adios2::format::BP5Base::MetaMetaInfoBlock_const&>
                  ((vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
                    *)&local_358,
                   (iterator)
                   local_358.
                   super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(MetaMetaInfoBlock *)local_2b8);
      }
      else {
        (local_358.
         super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaID = (char *)local_2b8._16_8_;
        (local_358.
         super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaIDLen = local_2b8._24_8_;
        (local_358.
         super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaInfo = (char *)local_2b8._0_8_;
        (local_358.
         super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish)->MetaMetaInfoLen = local_2b8._8_8_;
        local_358.
        super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_358.
             super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    p_Var10 = (FFSBuffer)create_FFSBuffer();
    pvVar11 = (void *)FFSencode(p_Var10,this->GenericAttributeFormat,this->PendingAttrs,&local_318);
    this_01 = (BufferFFS *)operator_new(0x50);
    BufferFFS::BufferFFS(this_01,p_Var10,pvVar11,local_318);
    FMfree_var_rec_elements(this->GenericAttributeFormat);
    if (this->PendingAttrs != (BP5AttrStruct *)0x0) {
      operator_delete(this->PendingAttrs);
    }
    this->PendingAttrs = (BP5AttrStruct *)0x0;
  }
  pcVar5 = (this_00->super_Buffer).m_Type._M_dataplus._M_p;
  (this_00->super_Buffer).m_Type._M_dataplus._M_p = (pointer)0x0;
  if ((this->Info).MetaFormat != (FMFormat)0x0) {
    FMfree_var_rec_elements();
  }
  if ((this->MetadataBuf != (void *)0x0) && (this->MetadataSize != 0)) {
    memset(this->MetadataBuf,0,this->MetadataSize);
  }
  pTVar6 = local_2e0;
  (this_00->super_Buffer).m_Type._M_dataplus._M_p = pcVar5;
  this->NewAttribute = false;
  (local_2e0->MetaEncodeBuffer).
  super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_2e0->AttributeEncodeBuffer).
  super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (local_2e0->NewMetaMetaBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_2e0->MetaEncodeBuffer).
  super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (local_2e0->NewMetaMetaBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2e0->NewMetaMetaBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2e0->AttributeEncodeBuffer).
  super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::operator=(&local_2e0->NewMetaMetaBlocks,&local_358);
  std::__shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>::
  reset<adios2::format::BufferFFS>
            (&(pTVar6->MetaEncodeBuffer).
              super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>,this_00);
  std::__shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>::
  reset<adios2::format::BufferFFS>
            (&(pTVar6->AttributeEncodeBuffer).
              super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>,this_01);
  pTVar6->DataBuffer = this->CurDataBuffer;
  this->CurDataBuffer = (BufferV *)0x0;
  if ((this->Info).AttributeFields != (FMFieldList)0x0) {
    free_FMfield_list();
    (this->Info).AttributeFields = (FMFieldList)0x0;
  }
  (this->Info).AttributeFieldCount = 0;
  pvVar11 = (this->Info).AttributeData;
  if (pvVar11 != (void *)0x0) {
    free(pvVar11);
    (this->Info).AttributeData = (void *)0x0;
  }
  (this->Info).AttributeSize = 0;
  if (local_358.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.
                    super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar6;
}

Assistant:

BP5Serializer::TimestepInfo BP5Serializer::CloseTimestep(int timestep, bool forceCopyDeferred)
{
    // EndStep()
    std::vector<MetaMetaInfoBlock> Formats;
    if (!Info.MetaFormat && Info.MetaFieldCount)
    {
        MetaMetaInfoBlock Block;
        FMStructDescRec struct_list[20] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {"MetaArray", MetaArrayRecListPtr, sizeof(MetaArrayRec), NULL},
            {"MetaArrayOp", MetaArrayRecOperatorListPtr, sizeof(MetaArrayRecOperator), NULL},
            {"MetaArrayMM1", MetaArrayRecMM1ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM1", MetaArrayRecOperatorMM1ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM2", MetaArrayRecMM2ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM2", MetaArrayRecOperatorMM2ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM4", MetaArrayRecMM4ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM4", MetaArrayRecOperatorMM4ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM8", MetaArrayRecMM8ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM8", MetaArrayRecOperatorMM8ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM16", MetaArrayRecMM16ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM16", MetaArrayRecOperatorMM16ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = "MetaData";
        struct_list[0].field_list = Info.MetaFields;
        struct_list[0].struct_size = FMstruct_size_field_list(Info.MetaFields, sizeof(char *));

        FMFormat Format = register_data_format(Info.LocalFMContext, &struct_list[0]);

        Info.MetaFormat = Format;
        int size;
        Block.MetaMetaInfo = get_server_rep_FMformat(Format, &size);
        Block.MetaMetaInfoLen = size;
        Block.MetaMetaID = get_server_ID_FMformat(Format, &size);
        Block.MetaMetaIDLen = size;
        Formats.push_back(Block);
    }
    if (NewAttribute && Info.AttributeFields)
    {
        MetaMetaInfoBlock Block;
        FMStructDescRec struct_list[4] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = "Attributes";
        struct_list[0].field_list = Info.AttributeFields;
        struct_list[0].struct_size = FMstruct_size_field_list(Info.AttributeFields, sizeof(char *));

        FMFormat Format = register_data_format(Info.LocalFMContext, &struct_list[0]);
        Info.AttributeFormat = Format;
        int size;
        Block.MetaMetaInfo = get_server_rep_FMformat(Format, &size);
        Block.MetaMetaInfoLen = size;
        Block.MetaMetaID = get_server_ID_FMformat(Format, &size);
        Block.MetaMetaIDLen = size;
        Formats.push_back(Block);
    }
    for (auto Format : NewStructFormats)
    {
        MetaMetaInfoBlock Block;
        int size;
        Block.MetaMetaInfo = get_server_rep_FMformat(Format, &size);
        Block.MetaMetaInfoLen = size;
        Block.MetaMetaID = get_server_ID_FMformat(Format, &size);
        Block.MetaMetaIDLen = size;
        Formats.push_back(Block);
    }
    NewStructFormats.clear();

    // Encode Metadata and Data to create contiguous data blocks
    FFSBuffer MetaEncodeBuffer = create_FFSBuffer();
    FFSBuffer AttributeEncodeBuffer = NULL;
    size_t MetaDataSize = 0;
    size_t AttributeSize = 0;
    struct BP5MetadataInfoStruct *MBase = (struct BP5MetadataInfoStruct *)MetadataBuf;

    if (CurDataBuffer == NULL)
    {
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Serializer", "CloseTimestep",
                                        "without prior Init");
    }

    //  Dump data for externs into iovec
    DumpDeferredBlocks(forceCopyDeferred);

    MBase->DataBlockSize =
        CurDataBuffer->AddToVec(0, NULL, m_BufferBlockSize, true); //  output block size aligned

    MBase->DataBlockSize += m_PriorDataBufferSizeTotal;

    ProcessDeferredMinMax();

    CollectFinalShapeValues();

    void *MetaDataBlock = FFSencode(MetaEncodeBuffer, Info.MetaFormat, MetadataBuf, &MetaDataSize);
    BufferFFS *Metadata = new BufferFFS(MetaEncodeBuffer, MetaDataBlock, MetaDataSize);

    BufferFFS *AttrData = NULL;

    if (PendingAttrs)
    {
        if (!GenericAttributeFormat)
        {
            MetaMetaInfoBlock Block;
            GenericAttributeFormat =
                register_data_format(Info.LocalFMContext, &attr_struct_list[0]);
            Info.AttributeFormat = GenericAttributeFormat;
            int size;
            Block.MetaMetaInfo = get_server_rep_FMformat(GenericAttributeFormat, &size);
            Block.MetaMetaInfoLen = size;
            Block.MetaMetaID = get_server_ID_FMformat(GenericAttributeFormat, &size);
            Block.MetaMetaIDLen = size;
            Formats.push_back(Block);
        }
        AttributeEncodeBuffer = create_FFSBuffer();
        void *AttributeBlock =
            FFSencode(AttributeEncodeBuffer, GenericAttributeFormat, PendingAttrs, &AttributeSize);
        AttrData = new BufferFFS(AttributeEncodeBuffer, AttributeBlock, AttributeSize);
        //	FMdump_encoded_data(GenericAttributeFormat, AttributeBlock,
        // 1024000);
        FMfree_var_rec_elements(GenericAttributeFormat, PendingAttrs);
        delete (PendingAttrs);
        PendingAttrs = nullptr;
    }
    else
    {
        // old way of doing attributes
        if (NewAttribute && Info.AttributeFields)
        {
            AttributeEncodeBuffer = create_FFSBuffer();
            void *AttributeBlock = FFSencode(AttributeEncodeBuffer, Info.AttributeFormat,
                                             Info.AttributeData, &AttributeSize);
            AttrData = new BufferFFS(AttributeEncodeBuffer, AttributeBlock, AttributeSize);
        }
    }

    // FMdump_encoded_data(Info.MetaFormat, MetaDataBlock, 1024000);
    /* free all those copied dimensions, etc */
    MBase = (struct BP5MetadataInfoStruct *)Metadata;
    size_t *tmp = MBase->BitField;
    /*
     * BitField value is saved away from FMfree_var_rec_elements() so that it
     * isn't unnecessarily free'd.
     */
    MBase->BitField = NULL;
    if (Info.MetaFormat)
        FMfree_var_rec_elements(Info.MetaFormat, MetadataBuf);
    if (MetadataBuf && MetadataSize)
        memset(MetadataBuf, 0, MetadataSize);
    MBase->BitField = tmp;
    NewAttribute = false;

    struct TimestepInfo Ret;
    Ret.NewMetaMetaBlocks = Formats;
    Ret.MetaEncodeBuffer.reset(Metadata);
    Ret.AttributeEncodeBuffer.reset(AttrData);
    Ret.DataBuffer = CurDataBuffer;
    CurDataBuffer = NULL;

    if (Info.AttributeFields)
    {
        free_FMfield_list(Info.AttributeFields);
        Info.AttributeFields = NULL;
    }
    Info.AttributeFieldCount = 0;

    if (Info.AttributeData)
    {
        free(Info.AttributeData);
        Info.AttributeData = NULL;
    }
    Info.AttributeSize = 0;

    return Ret;
}